

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int anon_unknown.dwarf_375::ReadFlags(int *argc,char ***argv,Options *options,BuildConfig *config)

{
  char *__s;
  int iVar1;
  long lVar2;
  Tool *pTVar3;
  bool bVar4;
  int local_19c;
  int local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  double local_128;
  double value_2;
  char *end_2;
  char *pcStack_110;
  int value_1;
  char *end_1;
  char *pcStack_100;
  int value;
  char *end;
  allocator<char> local_e1;
  string local_e0;
  int local_bc;
  undefined1 local_b8 [4];
  int opt;
  option kLongOptions [4];
  BuildConfig *config_local;
  Options *options_local;
  char ***argv_local;
  int *argc_local;
  
  iVar1 = GuessParallelism();
  config->parallelism = iVar1;
  memcpy(local_b8,&PTR_anon_var_dwarf_c2_00175740,0x80);
  while( true ) {
    bVar4 = false;
    if (options->tool == (Tool *)0x0) {
      local_bc = getopt_long(*argc,*argv,"d:f:j:k:l:nt:vw:C:h",local_b8,0);
      bVar4 = local_bc != -1;
    }
    __s = _optarg;
    if (!bVar4) break;
    switch(local_bc) {
    case 1:
      printf("%s\n",kNinjaVersion);
      return 0;
    case 0x43:
      options->working_dir = _optarg;
      break;
    case 100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,__s,&local_e1);
      bVar4 = DebugEnable(&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        return 1;
      }
      break;
    case 0x66:
      options->input_file = _optarg;
      break;
    case 0x68:
    default:
      Usage(config);
      return 1;
    case 0x6a:
      lVar2 = strtol(_optarg,&stack0xffffffffffffff00,10);
      end_1._4_4_ = (int)lVar2;
      if ((*pcStack_100 != '\0') || (end_1._4_4_ < 0)) {
        Fatal("invalid -j parameter");
      }
      local_198 = end_1._4_4_;
      if (end_1._4_4_ < 1) {
        local_198 = 0x7fffffff;
      }
      config->parallelism = local_198;
      break;
    case 0x6b:
      lVar2 = strtol(_optarg,&stack0xfffffffffffffef0,10);
      end_2._4_4_ = (int)lVar2;
      if (*pcStack_110 != '\0') {
        Fatal("-k parameter not numeric; did you mean -k 0?");
      }
      local_19c = end_2._4_4_;
      if (end_2._4_4_ < 1) {
        local_19c = 0x7fffffff;
      }
      config->failures_allowed = local_19c;
      break;
    case 0x6c:
      local_128 = strtod(_optarg,(char **)&value_2);
      if ((char *)value_2 == _optarg) {
        Fatal("-l parameter not numeric: did you mean -l 0.0?");
      }
      config->max_load_average = local_128;
      break;
    case 0x6e:
      config->dry_run = true;
      break;
    case 0x74:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,__s,&local_149);
      pTVar3 = ChooseTool(&local_148);
      options->tool = pTVar3;
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      if (options->tool == (Tool *)0x0) {
        return 0;
      }
      break;
    case 0x76:
      config->verbosity = VERBOSE;
      break;
    case 0x77:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__s,&local_171);
      bVar4 = WarningEnable(&local_170,options);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        return 1;
      }
    }
  }
  *argv = *argv + _optind;
  *argc = *argc - _optind;
  return -1;
}

Assistant:

int ReadFlags(int* argc, char*** argv,
              Options* options, BuildConfig* config) {
  config->parallelism = GuessParallelism();

  enum { OPT_VERSION = 1 };
  const option kLongOptions[] = {
    { "help", no_argument, NULL, 'h' },
    { "version", no_argument, NULL, OPT_VERSION },
    { "verbose", no_argument, NULL, 'v' },
    { NULL, 0, NULL, 0 }
  };

  int opt;
  while (!options->tool &&
         (opt = getopt_long(*argc, *argv, "d:f:j:k:l:nt:vw:C:h", kLongOptions,
                            NULL)) != -1) {
    switch (opt) {
      case 'd':
        if (!DebugEnable(optarg))
          return 1;
        break;
      case 'f':
        options->input_file = optarg;
        break;
      case 'j': {
        char* end;
        int value = strtol(optarg, &end, 10);
        if (*end != 0 || value < 0)
          Fatal("invalid -j parameter");

        // We want to run N jobs in parallel. For N = 0, INT_MAX
        // is close enough to infinite for most sane builds.
        config->parallelism = value > 0 ? value : INT_MAX;
        break;
      }
      case 'k': {
        char* end;
        int value = strtol(optarg, &end, 10);
        if (*end != 0)
          Fatal("-k parameter not numeric; did you mean -k 0?");

        // We want to go until N jobs fail, which means we should allow
        // N failures and then stop.  For N <= 0, INT_MAX is close enough
        // to infinite for most sane builds.
        config->failures_allowed = value > 0 ? value : INT_MAX;
        break;
      }
      case 'l': {
        char* end;
        double value = strtod(optarg, &end);
        if (end == optarg)
          Fatal("-l parameter not numeric: did you mean -l 0.0?");
        config->max_load_average = value;
        break;
      }
      case 'n':
        config->dry_run = true;
        break;
      case 't':
        options->tool = ChooseTool(optarg);
        if (!options->tool)
          return 0;
        break;
      case 'v':
        config->verbosity = BuildConfig::VERBOSE;
        break;
      case 'w':
        if (!WarningEnable(optarg, options))
          return 1;
        break;
      case 'C':
        options->working_dir = optarg;
        break;
      case OPT_VERSION:
        printf("%s\n", kNinjaVersion);
        return 0;
      case 'h':
      default:
        Usage(*config);
        return 1;
    }
  }
  *argv += optind;
  *argc -= optind;

  return -1;
}